

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O0

void __thiscall
Qentem::
HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
::RemoveIndex(HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
              *this,SizeT index)

{
  SizeT SVar1;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *pHVar2;
  char16_t *__filename;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *item;
  SizeT index_local;
  HashTable<Qentem::String<char16_t>,_Qentem::HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_>_>
  *this_local;
  
  SVar1 = Size(this);
  if (index < SVar1) {
    pHVar2 = Storage(this);
    pHVar2 = pHVar2 + index;
    if (pHVar2->Hash != 0) {
      __filename = String<char16_t>::First(&pHVar2->Key);
      String<char16_t>::Length(&pHVar2->Key);
      remove(this,(char *)__filename);
    }
  }
  return;
}

Assistant:

void RemoveIndex(const SizeT index) const noexcept {
        if (index < Size()) {
            const HItem *item = (Storage() + index);

            if (item->Hash != 0) {
                remove(item->Key.First(), item->Key.Length(), item->Hash);
            }
        }
    }